

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataBuffer.cpp
# Opt level: O2

void __thiscall DataBuffer::checkSpace(DataBuffer *this,int bytes)

{
  int iVar1;
  char *__src;
  int iVar2;
  int iVar3;
  char *__dest;
  int iVar4;
  
  __src = this->m_buffer;
  iVar2 = (int)this->m_position - (int)__src;
  iVar1 = this->m_allocatedSize;
  if (bytes + iVar2 < iVar1) {
    return;
  }
  iVar4 = bytes + iVar1 + 0x200;
  iVar3 = -1;
  if (-1 < iVar4) {
    iVar3 = iVar4;
  }
  __dest = (char *)operator_new__((long)iVar3);
  this->m_buffer = __dest;
  this->m_allocatedSize = iVar4;
  memcpy(__dest,__src,(long)iVar1);
  this->m_position = __dest + iVar2;
  operator_delete(__src);
  return;
}

Assistant:

void DataBuffer::checkSpace (int bytes)
{
	int writesize = writtenSize();

	if (writesize + bytes < allocatedSize())
		return;

	// We don't have enough space in the buffer to write
	// the stuff - thus resize.

	// Remake the buffer with the new size. Have enough space
	// for the stuff we're going to write, as well as a bit
	// of leeway so we don't have to resize immediately again.

	int oldsize = allocatedSize();
	int newsize = oldsize + bytes + 512;

	char* buf = buffer();
	setBuffer (new char[newsize]);
	setAllocatedSize (newsize);

	// Now, copy the stuff back.
	std::memcpy (m_buffer, buf, oldsize);
	setPosition (buffer() + writesize);

	delete buf;
}